

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_count(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  anon_union_8_3_18420de5_for_x aVar1;
  jx9_value *pjVar2;
  uint bRecursive;
  
  if (nArg < 1) {
    pjVar2 = pCtx->pRet;
    jx9MemObjRelease(pjVar2);
    (pjVar2->x).rVal = 0.0;
  }
  else {
    pjVar2 = *apArg;
    if ((pjVar2->iFlags & 0x40U) == 0) {
      aVar1.iVal._1_7_ = 0;
      aVar1.iVal._0_1_ = (pjVar2->iFlags & 0x20U) == 0;
    }
    else {
      bRecursive = 0;
      if (nArg != 1) {
        pjVar2 = apArg[1];
        jx9MemObjToInteger(pjVar2);
        bRecursive = (uint)(*(int *)&pjVar2->x == 1);
        pjVar2 = *apArg;
      }
      aVar1.iVal = HashmapCount((jx9_hashmap *)(pjVar2->x).pOther,bRecursive,0);
    }
    pjVar2 = pCtx->pRet;
    jx9MemObjRelease(pjVar2);
    pjVar2->x = aVar1;
  }
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9_hashmap_count(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int bRecursive = FALSE;
	sxi64 iCount;
	if( nArg < 1 ){
		/* Missing arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* TICKET 1433-19: Handle objects */
		int res = !jx9_value_is_null(apArg[0]);
		jx9_result_int(pCtx, res);
		return JX9_OK;
	}
	if( nArg > 1 ){
		/* Recursive count? */
		bRecursive = jx9_value_to_int(apArg[1]) == 1 /* COUNT_RECURSIVE */;
	}
	/* Count */
	iCount = HashmapCount((jx9_hashmap *)apArg[0]->x.pOther, bRecursive, 0);
	jx9_result_int64(pCtx, iCount);
	return JX9_OK;
}